

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

double DistanceToCapsuleAxisHelper(ON_RTreeCapsule *a_capsule,ON_RTreeBBox *a_rect)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_Line local_38;
  
  dVar1 = a_capsule->m_domain[0];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar5 = 1.0 - dVar1;
    dVar2 = a_capsule->m_point[0][0];
    dVar3 = a_capsule->m_point[0][1];
    local_38.from.x = dVar5 * dVar2 + dVar1 * a_capsule->m_point[1][0];
    local_38.from.y = dVar5 * dVar3 + dVar1 * a_capsule->m_point[1][1];
    dVar4 = a_capsule->m_point[0][2];
    local_38.from.z = dVar5 * dVar4 + dVar1 * a_capsule->m_point[1][2];
    dVar1 = a_capsule->m_domain[1];
  }
  else {
    dVar1 = a_capsule->m_domain[1];
    if ((dVar1 == 1.0) && (!NAN(dVar1))) {
      dVar1 = ON_BoundingBox::MinimumDistanceTo((ON_BoundingBox *)a_rect,(ON_Line *)a_capsule);
      return dVar1;
    }
    dVar2 = a_capsule->m_point[0][0];
    dVar3 = a_capsule->m_point[0][1];
    dVar4 = a_capsule->m_point[0][2];
    local_38.from.x = dVar2;
    local_38.from.y = dVar3;
    local_38.from.z = dVar4;
  }
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar5 = 1.0 - dVar1;
    local_38.to.x = dVar5 * dVar2 + dVar1 * a_capsule->m_point[1][0];
    local_38.to.y = dVar5 * dVar3 + dVar1 * a_capsule->m_point[1][1];
    local_38.to.z = dVar5 * dVar4 + dVar1 * a_capsule->m_point[1][2];
  }
  else {
    local_38.to.x = a_capsule->m_point[1][0];
    local_38.to.y = a_capsule->m_point[1][1];
    local_38.to.z = a_capsule->m_point[1][2];
  }
  dVar1 = ON_BoundingBox::MinimumDistanceTo((ON_BoundingBox *)a_rect,&local_38);
  return dVar1;
}

Assistant:

static double DistanceToCapsuleAxisHelper(const struct ON_RTreeCapsule* a_capsule, const ON_RTreeBBox* a_rect)
{
  double L[2][3], s[2];
  if ( 0.0 == a_capsule->m_domain[0] && 1.0 == a_capsule->m_domain[1] )
    return ((const ON_BoundingBox*)a_rect->m_min)->MinimumDistanceTo( *((const ON_Line*)a_capsule->m_point[0]) );

  if ( 0.0 == a_capsule->m_domain[0] )
  {
    L[0][0] = a_capsule->m_point[0][0];
    L[0][1] = a_capsule->m_point[0][1];
    L[0][2] = a_capsule->m_point[0][2];
  }
  else
  {
    s[0] = 1.0 - a_capsule->m_domain[0];
    s[1] = a_capsule->m_domain[0];
    L[0][0] = s[0]*a_capsule->m_point[0][0] + s[1]*a_capsule->m_point[1][0];
    L[0][1] = s[0]*a_capsule->m_point[0][1] + s[1]*a_capsule->m_point[1][1];
    L[0][2] = s[0]*a_capsule->m_point[0][2] + s[1]*a_capsule->m_point[1][2];
  }

  if ( 0.0 == a_capsule->m_domain[1] )
  {
    L[1][0] = a_capsule->m_point[1][0];
    L[1][1] = a_capsule->m_point[1][1];
    L[1][2] = a_capsule->m_point[1][2];
  }
  else
  {
    s[0] = 1.0 - a_capsule->m_domain[1];
    s[1] = a_capsule->m_domain[1];
    L[1][0] = s[0]*a_capsule->m_point[0][0] + s[1]*a_capsule->m_point[1][0];
    L[1][1] = s[0]*a_capsule->m_point[0][1] + s[1]*a_capsule->m_point[1][1];
    L[1][2] = s[0]*a_capsule->m_point[0][2] + s[1]*a_capsule->m_point[1][2];
  }

  return ((const ON_BoundingBox*)a_rect->m_min)->MinimumDistanceTo( *((const ON_Line*)L[0]) );
}